

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Importer::ImportAnimations(glTF2Importer *this,Asset *r)

{
  uint uVar1;
  aiScene *paVar2;
  Animation *anim;
  uint uVar3;
  aiAnimation **ppaVar4;
  pointer ppAVar5;
  aiAnimation *paVar6;
  aiNodeAnim **ppaVar7;
  aiNodeAnim *paVar8;
  ulong uVar9;
  uint uVar10;
  Asset *r_00;
  __node_base _Var11;
  ulong uVar12;
  long lVar13;
  size_type sVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  samplers;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if ((r->scene).vector != (vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *)0x0) {
    this->mScene->mNumAnimations =
         (uint)((ulong)((long)(r->animations).mObjs.
                              super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(r->animations).mObjs.
                             super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    paVar2 = this->mScene;
    uVar12 = (ulong)paVar2->mNumAnimations;
    if (uVar12 != 0) {
      ppaVar4 = (aiAnimation **)operator_new__(uVar12 << 3);
      paVar2->mAnimations = ppaVar4;
      ppAVar5 = (r->animations).mObjs.
                super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (((long)(r->animations).mObjs.
                 super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)ppAVar5 & 0x7fffffff8U) != 0) {
        uVar12 = 0;
        do {
          anim = ppAVar5[uVar12];
          paVar6 = (aiAnimation *)operator_new(0x448);
          (paVar6->mName).length = 0;
          (paVar6->mName).data[0] = '\0';
          memset((paVar6->mName).data + 1,0x1b,0x3ff);
          paVar6->mDuration = -1.0;
          paVar6->mTicksPerSecond = 0.0;
          paVar6->mNumChannels = 0;
          paVar6->mChannels = (aiNodeAnim **)0x0;
          paVar6->mNumMeshChannels = 0;
          paVar6->mMeshChannels = (aiMeshAnim **)0x0;
          paVar6->mNumMorphMeshChannels = 0;
          paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
          uVar9 = (anim->super_Object).name._M_string_length;
          if (uVar9 < 0x400) {
            (paVar6->mName).length = (ai_uint32)uVar9;
            memcpy((paVar6->mName).data,(anim->super_Object).name._M_dataplus._M_p,uVar9);
            (paVar6->mName).data[uVar9] = '\0';
          }
          paVar6->mDuration = 0.0;
          paVar6->mTicksPerSecond = 0.0;
          GatherSamplers((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)&local_68,anim);
          sVar14 = local_68._M_element_count;
          paVar6->mNumChannels = (uint)local_68._M_element_count;
          dVar15 = 0.0;
          uVar10 = 0;
          if ((uint)local_68._M_element_count != 0) {
            r_00 = (Asset *)((local_68._M_element_count & 0xffffffff) << 3);
            ppaVar7 = (aiNodeAnim **)operator_new__((ulong)r_00);
            paVar6->mChannels = ppaVar7;
            if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              lVar13 = 0;
              _Var11._M_nxt = local_68._M_before_begin._M_nxt;
              do {
                paVar8 = CreateNodeAnim(r_00,(r->nodes).mObjs.
                                             super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [*(uint *)&_Var11._M_nxt[1]._M_nxt],
                                        (AnimationSamplers *)(_Var11._M_nxt + 2));
                *(aiNodeAnim **)((long)paVar6->mChannels + lVar13) = paVar8;
                _Var11._M_nxt = (_Var11._M_nxt)->_M_nxt;
                lVar13 = lVar13 + 8;
              } while (_Var11._M_nxt != (_Hash_node_base *)0x0);
              sVar14 = (size_type)paVar6->mNumChannels;
              dVar15 = 0.0;
              uVar10 = 0;
              if (paVar6->mNumChannels == 0) goto LAB_00644f88;
            }
            uVar9 = 0;
            dVar15 = 0.0;
            uVar10 = 0;
            do {
              paVar8 = paVar6->mChannels[uVar9];
              uVar1 = paVar8->mNumPositionKeys;
              dVar16 = dVar15;
              if (uVar1 != 0) {
                uVar3 = uVar1;
                if (uVar1 < uVar10) {
                  uVar3 = uVar10;
                }
                uVar10 = uVar3;
                dVar16 = paVar8->mPositionKeys[uVar1 - 1].mTime;
                if (dVar16 <= dVar15) {
                  dVar16 = dVar15;
                }
              }
              uVar1 = paVar8->mNumRotationKeys;
              dVar17 = dVar16;
              if (uVar1 != 0) {
                uVar3 = uVar1;
                if (uVar1 < uVar10) {
                  uVar3 = uVar10;
                }
                uVar10 = uVar3;
                dVar17 = paVar8->mRotationKeys[uVar1 - 1].mTime;
                if (dVar17 <= dVar16) {
                  dVar17 = dVar16;
                }
              }
              uVar1 = paVar8->mNumScalingKeys;
              dVar15 = dVar17;
              if (uVar1 != 0) {
                uVar3 = uVar1;
                if (uVar1 < uVar10) {
                  uVar3 = uVar10;
                }
                uVar10 = uVar3;
                dVar15 = paVar8->mScalingKeys[uVar1 - 1].mTime;
                if (dVar15 <= dVar17) {
                  dVar15 = dVar17;
                }
              }
              uVar9 = uVar9 + 1;
            } while ((sVar14 & 0xffffffff) != uVar9);
          }
LAB_00644f88:
          paVar6->mDuration = dVar15;
          if (uVar10 == 0) {
            dVar15 = 30.0;
          }
          else {
            dVar15 = (double)(~-(ulong)(0.0 < dVar15) & 0x403e000000000000 |
                             (ulong)((double)uVar10 / (dVar15 / 1000.0)) & -(ulong)(0.0 < dVar15));
          }
          paVar6->mTicksPerSecond = dVar15;
          this->mScene->mAnimations[uVar12] = paVar6;
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_AnimationSamplers>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_68);
          uVar12 = uVar12 + 1;
          ppAVar5 = (r->animations).mObjs.
                    super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < ((ulong)((long)(r->animations).mObjs.
                                         super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppAVar5)
                           >> 3 & 0xffffffff));
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportAnimations(glTF2::Asset& r)
{
    if (!r.scene) return;

    mScene->mNumAnimations = r.animations.Size();
    if (mScene->mNumAnimations == 0) {
        return;
    }

    mScene->mAnimations = new aiAnimation*[mScene->mNumAnimations];
    for (unsigned int i = 0; i < r.animations.Size(); ++i) {
        Animation& anim = r.animations[i];

        aiAnimation* ai_anim = new aiAnimation();
        ai_anim->mName = anim.name;
        ai_anim->mDuration = 0;
        ai_anim->mTicksPerSecond = 0;

        std::unordered_map<unsigned int, AnimationSamplers> samplers = GatherSamplers(anim);

        ai_anim->mNumChannels = static_cast<uint32_t>(samplers.size());
        if (ai_anim->mNumChannels > 0) {
            ai_anim->mChannels = new aiNodeAnim*[ai_anim->mNumChannels];
            int j = 0;
            for (auto& iter : samplers) {
                ai_anim->mChannels[j] = CreateNodeAnim(r, r.nodes[iter.first], iter.second);
                ++j;
            }
        }

        // Use the latest keyframe for the duration of the animation
        double maxDuration = 0;
        unsigned int maxNumberOfKeys = 0;
        for (unsigned int j = 0; j < ai_anim->mNumChannels; ++j) {
            auto chan = ai_anim->mChannels[j];
            if (chan->mNumPositionKeys) {
                auto lastPosKey = chan->mPositionKeys[chan->mNumPositionKeys - 1];
                if (lastPosKey.mTime > maxDuration) {
                    maxDuration = lastPosKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumPositionKeys);
            }
            if (chan->mNumRotationKeys) {
                auto lastRotKey = chan->mRotationKeys[chan->mNumRotationKeys - 1];
                if (lastRotKey.mTime > maxDuration) {
                    maxDuration = lastRotKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumRotationKeys);
            }
            if (chan->mNumScalingKeys) {
                auto lastScaleKey = chan->mScalingKeys[chan->mNumScalingKeys - 1];
                if (lastScaleKey.mTime > maxDuration) {
                    maxDuration = lastScaleKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumScalingKeys);
            }
        }
        ai_anim->mDuration = maxDuration;
        ai_anim->mTicksPerSecond = (maxNumberOfKeys > 0 && maxDuration > 0) ? (maxNumberOfKeys / (maxDuration/1000)) : 30;

        mScene->mAnimations[i] = ai_anim;
    }
}